

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_api.c
# Opt level: O0

void solver_rebuild_order(solver_t *s)

{
  char cVar1;
  uint uVar2;
  vec_uint_t *entries;
  vec_uint_t *vars;
  uint var;
  solver_t *s_local;
  
  uVar2 = vec_char_size(s->assigns);
  entries = vec_uint_alloc(uVar2);
  vars._4_4_ = 0;
  while( true ) {
    uVar2 = vec_char_size(s->assigns);
    if (uVar2 <= vars._4_4_) break;
    cVar1 = var_value(s,vars._4_4_);
    if (cVar1 == '\x03') {
      vec_uint_push_back(entries,vars._4_4_);
    }
    vars._4_4_ = vars._4_4_ + 1;
  }
  heap_build(s->var_order,entries);
  vec_uint_free(entries);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

//===------------------------------------------------------------------------===
// Satoko internal functions
//===------------------------------------------------------------------------===
static inline void solver_rebuild_order(solver_t *s)
{
    unsigned var;
    vec_uint_t *vars = vec_uint_alloc(vec_char_size(s->assigns));

    for (var = 0; var < vec_char_size(s->assigns); var++)
        if (var_value(s, var) == SATOKO_VAR_UNASSING)
            vec_uint_push_back(vars, var);
    heap_build(s->var_order, vars);
    vec_uint_free(vars);
}